

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::anon_unknown_0::ShaderTypeCase::test(ShaderTypeCase *this)

{
  CallLogWrapper *this_00;
  GLenum type;
  GLuint shader;
  long lVar1;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    type = *(GLenum *)((long)&DAT_018258d8 + lVar1);
    shader = glu::CallLogWrapper::glCreateShader(this_00,type);
    verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                      this_00,shader,0x8b4f,type);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
  }
  return;
}

Assistant:

void test (void)
	{
		const GLenum shaderTypes[] = {GL_VERTEX_SHADER, GL_FRAGMENT_SHADER};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
		{
			const GLuint shader = glCreateShader(shaderTypes[ndx]);
			verifyShaderParam(m_testCtx, *this, shader, GL_SHADER_TYPE, shaderTypes[ndx]);
			glDeleteShader(shader);
		}
	}